

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O0

void __thiscall EnrichableSpiAnalyzer::GetWord(EnrichableSpiAnalyzer *this)

{
  uint uVar1;
  MarkerType MVar2;
  value_type vVar3;
  bool bVar4;
  bool bVar5;
  element_type *peVar6;
  U64 UVar7;
  element_type *peVar8;
  size_type sVar9;
  reference pvVar10;
  element_type *peVar11;
  U64 packetId;
  reference pMVar12;
  Marker *marker;
  iterator __end2;
  iterator __begin2;
  vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
  *__range2;
  Channel *channel;
  vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
  markers;
  U32 i_1;
  U32 count;
  U64 frameIndex;
  Frame result_frame;
  uint local_58;
  U32 i;
  bool need_reset;
  U64 first_sample;
  U64 miso_word;
  DataBuilder miso_result;
  undefined8 local_28;
  U64 mosi_word;
  DataBuilder mosi_result;
  U32 bits_per_transfer;
  EnrichableSpiAnalyzer *this_local;
  
  peVar6 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  uVar1 = peVar6->mBitsPerTransfer;
  DataBuilder::DataBuilder((DataBuilder *)&mosi_word);
  local_28 = 0;
  peVar6 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  DataBuilder::Reset((ulonglong *)&mosi_word,(ShiftOrder)&local_28,peVar6->mShiftOrder);
  DataBuilder::DataBuilder((DataBuilder *)&miso_word);
  first_sample = 0;
  peVar6 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
  DataBuilder::Reset(&miso_word,(ShiftOrder)&first_sample,peVar6->mShiftOrder);
  _i = 0;
  bVar4 = false;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::clear
            (&this->mArrowLocations);
  AnalyzerChannelData::GetSampleNumber();
  Analyzer::ReportProgress((ulonglong)this);
  for (local_58 = 0; local_58 < uVar1; local_58 = local_58 + 1) {
    if (local_58 == 0) {
      Analyzer::CheckIfThreadShouldExit();
    }
    bVar5 = WouldAdvancingTheClockToggleEnable(this);
    if (bVar5) {
      AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
      goto LAB_00110f26;
    }
    AnalyzerChannelData::AdvanceToNextEdge();
    if (local_58 == 0) {
      _i = AnalyzerChannelData::GetSampleNumber();
    }
    peVar6 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
    if (peVar6->mDataValidEdge == LeadingEdge) {
      UVar7 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar7;
      if (this->mMosi != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit((BitState)&mosi_word);
      }
      if (this->mMiso != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit((BitState)&miso_word);
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mArrowLocations,&this->mCurrentSample);
    }
    if ((local_58 == uVar1 - 1) &&
       (peVar6 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings),
       peVar6->mDataValidEdge != TrailingEdge)) {
      bVar5 = WouldAdvancingTheClockToggleEnable(this);
      if (bVar5) {
        bVar4 = true;
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      break;
    }
    bVar5 = WouldAdvancingTheClockToggleEnable(this);
    if (bVar5) {
      AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
      goto LAB_00110f26;
    }
    AnalyzerChannelData::AdvanceToNextEdge();
    peVar6 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
    if (peVar6->mDataValidEdge == TrailingEdge) {
      UVar7 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar7;
      if (this->mMosi != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit((BitState)&mosi_word);
      }
      if (this->mMiso != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit((BitState)&miso_word);
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mArrowLocations,&this->mCurrentSample);
    }
  }
  Frame::Frame((Frame *)&frameIndex);
  frameIndex = _i;
  _result_frame = AnalyzerChannelData::GetSampleNumber();
  this->packetFrameIndex = this->packetFrameIndex + '\x01';
  peVar8 = std::auto_ptr<EnrichableSpiAnalyzerResults>::operator->(&this->mResults);
  UVar7 = AnalyzerResults::AddFrame((Frame *)peVar8);
  sVar9 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                    (&this->mArrowLocations);
  markers.
  super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)sVar9;
  for (markers.
       super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (uint)markers.
            super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage <
      markers.
      super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      markers.
      super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)markers.
                 super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    peVar8 = std::auto_ptr<EnrichableSpiAnalyzerResults>::operator->(&this->mResults);
    pvVar10 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (&this->mArrowLocations,
                         (ulong)(uint)markers.
                                      super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    vVar3 = *pvVar10;
    MVar2 = this->mArrowMarker;
    std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerResults::AddMarker((ulonglong)peVar8,(MarkerType)vVar3,(Channel *)(ulong)MVar2);
  }
  peVar11 = std::auto_ptr<EnrichableAnalyzerSubprocess>::operator->(&this->mSubprocess);
  bVar5 = EnrichableAnalyzerSubprocess::MarkerEnabled(peVar11);
  if (bVar5) {
    peVar11 = std::auto_ptr<EnrichableAnalyzerSubprocess>::operator->(&this->mSubprocess);
    std::auto_ptr<EnrichableSpiAnalyzerResults>::operator->(&this->mResults);
    packetId = AnalyzerResults::GetNumPackets();
    EnrichableAnalyzerSubprocess::EmitMarker
              ((vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                *)&channel,peVar11,packetId,UVar7,(Frame *)&frameIndex,
               markers.
               super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    __range2 = (vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                *)0x0;
    __end2 = std::
             vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
             ::begin((vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                      *)&channel);
    marker = (Marker *)
             std::
             vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
             ::end((vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                    *)&channel);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<EnrichableAnalyzerSubprocess::Marker_*,_std::vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>_>
                                       *)&marker), bVar5) {
      pMVar12 = __gnu_cxx::
                __normal_iterator<EnrichableAnalyzerSubprocess::Marker_*,_std::vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>_>
                ::operator*(&__end2);
      bVar5 = std::operator==(&pMVar12->channelName,"miso");
      if (bVar5) {
        peVar6 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
        __range2 = (vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                    *)&peVar6->mMisoChannel;
      }
      else {
        bVar5 = std::operator==(&pMVar12->channelName,"mosi");
        if (bVar5) {
          peVar6 = std::auto_ptr<EnrichableSpiAnalyzerSettings>::operator->(&this->mSettings);
          __range2 = (vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                      *)&peVar6->mMosiChannel;
        }
      }
      if (__range2 ==
          (vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
           *)0x0) break;
      peVar8 = std::auto_ptr<EnrichableSpiAnalyzerResults>::operator->(&this->mResults);
      pvVar10 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                          (&this->mArrowLocations,(ulong)pMVar12->sampleNumber);
      AnalyzerResults::AddMarker
                ((ulonglong)peVar8,(MarkerType)*pvVar10,(Channel *)(ulong)pMVar12->markerType);
      __gnu_cxx::
      __normal_iterator<EnrichableAnalyzerSubprocess::Marker_*,_std::vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
    ::~vector((vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
               *)&channel);
  }
  std::auto_ptr<EnrichableSpiAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::CommitResults();
  if (bVar4) {
    AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
  }
  Frame::~Frame((Frame *)&frameIndex);
LAB_00110f26:
  DataBuilder::~DataBuilder((DataBuilder *)&miso_word);
  DataBuilder::~DataBuilder((DataBuilder *)&mosi_word);
  return;
}

Assistant:

void EnrichableSpiAnalyzer::GetWord()
{
	//we're assuming we come into this function with the clock in the idle state;

	U32 bits_per_transfer = mSettings->mBitsPerTransfer;

	DataBuilder mosi_result;
	U64 mosi_word = 0;
	mosi_result.Reset( &mosi_word, mSettings->mShiftOrder, bits_per_transfer );

	DataBuilder miso_result;
	U64 miso_word = 0;
	miso_result.Reset( &miso_word, mSettings->mShiftOrder, bits_per_transfer );

	U64 first_sample = 0;
	bool need_reset = false;

	mArrowLocations.clear();
	ReportProgress( mClock->GetSampleNumber() );

	for( U32 i=0; i<bits_per_transfer; i++ )
	{
		if( i == 0 )
			CheckIfThreadShouldExit();

		//on every single edge, we need to check that enable doesn't toggle.
		//note that we can't just advance the enable line to the next edge, becuase there may not be another edge

		if( WouldAdvancingTheClockToggleEnable() == true )
		{
			AdvanceToActiveEnableEdgeWithCorrectClockPolarity();  //ok, we pretty much need to reset everything and return.
			return;
		}
		
		mClock->AdvanceToNextEdge();
		if( i == 0 )
			first_sample = mClock->GetSampleNumber();

		if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
		{
			mCurrentSample = mClock->GetSampleNumber();
			if( mMosi != NULL )
			{
				mMosi->AdvanceToAbsPosition( mCurrentSample );
				mosi_result.AddBit( mMosi->GetBitState() );
			}
			if( mMiso != NULL )
			{
				mMiso->AdvanceToAbsPosition( mCurrentSample );
				miso_result.AddBit( mMiso->GetBitState() );
			}
			mArrowLocations.push_back( mCurrentSample );
		}


		// ok, the trailing edge is messy -- but only on the very last bit.
		// If the trialing edge isn't doesn't represent valid data, we want to allow the enable line to rise before the clock trialing edge -- and still report the frame
		if( ( i == ( bits_per_transfer - 1 ) ) && ( mSettings->mDataValidEdge != AnalyzerEnums::TrailingEdge ) )
		{
			//if this is the last bit, and the trailing edge doesn't represent valid data
			if( WouldAdvancingTheClockToggleEnable() == true )
			{
				//moving to the trailing edge would cause the clock to revert to inactive.  jump out, record the frame, and them move to the next active enable edge
				need_reset = true;
				break;
			}
			
			//enable isn't going to go inactive, go ahead and advance the clock as usual.  Then we're done, jump out and record the frame.
			mClock->AdvanceToNextEdge();
			break;
		}
		
		//this isn't the very last bit, etc, so proceed as normal
		if( WouldAdvancingTheClockToggleEnable() == true )
		{
			AdvanceToActiveEnableEdgeWithCorrectClockPolarity();  //ok, we pretty much need to reset everything and return.
			return;
		}

		mClock->AdvanceToNextEdge();

		if( mSettings->mDataValidEdge == AnalyzerEnums::TrailingEdge )
		{
			mCurrentSample = mClock->GetSampleNumber();
			if( mMosi != NULL )
			{
				mMosi->AdvanceToAbsPosition( mCurrentSample );
				mosi_result.AddBit( mMosi->GetBitState() );
			}
			if( mMiso != NULL )
			{
				mMiso->AdvanceToAbsPosition( mCurrentSample );
				miso_result.AddBit( mMiso->GetBitState() );
			}
			mArrowLocations.push_back( mCurrentSample );
		}
		
	}

	Frame result_frame;
	result_frame.mStartingSampleInclusive = first_sample;
	result_frame.mEndingSampleInclusive = mClock->GetSampleNumber();
	result_frame.mData1 = mosi_word;
	result_frame.mData2 = miso_word;
	result_frame.mFlags = 0;
	result_frame.mType = packetFrameIndex++;
	U64 frameIndex = mResults->AddFrame( result_frame );

	//save the resuls:
	U32 count = mArrowLocations.size();
	for( U32 i=0; i<count; i++ ) {
		mResults->AddMarker(
			mArrowLocations[i], mArrowMarker, mSettings->mClockChannel
		);
	}

	if(mSubprocess->MarkerEnabled()) {
		std::vector<EnrichableAnalyzerSubprocess::Marker> markers = mSubprocess->EmitMarker(
			mResults->GetNumPackets(),
			frameIndex,
			result_frame,
			count
		);

		Channel* channel = NULL;
		for(const EnrichableAnalyzerSubprocess::Marker& marker : markers) {
			if(marker.channelName == "miso") {
				channel = &mSettings->mMisoChannel;
			} else if (marker.channelName == "mosi") {
				channel = &mSettings->mMosiChannel;
			}
			if(channel != NULL) {
				mResults->AddMarker(
					mArrowLocations[marker.sampleNumber],
					marker.markerType,
					*channel
				);
			} else {
				break;
				std::cerr << "Received marker request for invalid marker: ";
				std::cerr << marker.channelName;
				std::cerr << " ignoring.\n";
			}
		}
	}
	
	mResults->CommitResults();

	if( need_reset == true )
		AdvanceToActiveEnableEdgeWithCorrectClockPolarity();
}